

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall
brynet::net::AsyncConnector::asyncConnect
          (AsyncConnector *this,string *ip,int port,nanoseconds timeout,
          COMPLETED_CALLBACK *successCB,FAILED_CALLBACK *failedCB)

{
  bool bVar1;
  element_type *peVar2;
  runtime_error *prVar3;
  element_type *this_00;
  anon_class_128_2_889b0697 local_180;
  USER_PROC local_100;
  rep local_e0;
  undefined1 local_d8 [8];
  AsyncConnectAddr address;
  shared_ptr<brynet::net::ConnectorWorkInfo> workInfo;
  undefined1 local_48 [8];
  shared_lock<std::shared_mutex> lck;
  FAILED_CALLBACK *failedCB_local;
  COMPLETED_CALLBACK *successCB_local;
  int port_local;
  string *ip_local;
  AsyncConnector *this_local;
  nanoseconds timeout_local;
  
  lck._8_8_ = failedCB;
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)local_48,&this->mThreadGuard);
  bVar1 = std::operator==(successCB,(nullptr_t)0x0);
  if (!bVar1) {
    bVar1 = std::operator==(failedCB,(nullptr_t)0x0);
    if (!bVar1) {
      peVar2 = std::__shared_ptr_access<bool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                         ((__shared_ptr_access<bool,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->mIsRun);
      if ((*peVar2 & 1U) == 0) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"work thread already stop");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::shared_ptr<brynet::net::ConnectorWorkInfo>::shared_ptr
                ((shared_ptr<brynet::net::ConnectorWorkInfo> *)&address.mFailedCB._M_invoker,
                 &this->mWorkInfo);
      local_e0 = timeout.__r;
      AsyncConnectAddr::AsyncConnectAddr
                ((AsyncConnectAddr *)local_d8,ip,port,timeout,successCB,failedCB);
      this_00 = std::
                __shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->mEventLoop);
      std::shared_ptr<brynet::net::ConnectorWorkInfo>::shared_ptr
                (&local_180.workInfo,
                 (shared_ptr<brynet::net::ConnectorWorkInfo> *)&address.mFailedCB._M_invoker);
      AsyncConnectAddr::AsyncConnectAddr(&local_180.address,(AsyncConnectAddr *)local_d8);
      std::function<void()>::
      function<brynet::net::AsyncConnector::asyncConnect(std::__cxx11::string_const&,int,std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::function<void(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>)>,std::function<void()>)::__0,void>
                ((function<void()> *)&local_100,&local_180);
      EventLoop::pushAsyncProc(this_00,&local_100);
      std::function<void_()>::~function(&local_100);
      asyncConnect(std::__cxx11::string_const&,int,std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::function<void(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>)>,std::function<void()>)
      ::$_0::~__0((__0 *)&local_180);
      AsyncConnectAddr::~AsyncConnectAddr((AsyncConnectAddr *)local_d8);
      std::shared_ptr<brynet::net::ConnectorWorkInfo>::~shared_ptr
                ((shared_ptr<brynet::net::ConnectorWorkInfo> *)&address.mFailedCB._M_invoker);
      std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)local_48);
      return;
    }
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"all callback is nullptr");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AsyncConnector::asyncConnect(const std::string& ip, 
    int port, 
    std::chrono::nanoseconds timeout,
    COMPLETED_CALLBACK successCB, 
    FAILED_CALLBACK failedCB)
{
#ifdef HAVE_LANG_CXX17
    std::shared_lock<std::shared_mutex> lck(mThreadGuard);
#else
    std::lock_guard<std::mutex> lck(mThreadGuard);
#endif

    if (successCB == nullptr || failedCB == nullptr)
    {
        throw std::runtime_error("all callback is nullptr");
    }

    if (!(*mIsRun))
    {
        throw std::runtime_error("work thread already stop");
    }

    auto workInfo = mWorkInfo;
    auto address = AsyncConnectAddr(ip,
        port,
        timeout,
        successCB,
        failedCB);
    mEventLoop->pushAsyncProc([workInfo, address]() {
        workInfo->processConnect(address);
    });
}